

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void flatbuffers::tests::ValidSameNameDifferentNamespaceTest(void)

{
  bool bVar1;
  IDLOptions IStack_a98;
  Parser local_788;
  
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"namespace A; table X {} namespace B; table X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; table X {} namespace B; table X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x35a,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"namespace A; union X {} namespace B; union X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; union X {} namespace B; union X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x35d,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"namespace A; table X {} namespace B; union X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; table X {} namespace B; union X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x360,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"namespace A; union X {} namespace B; table X {}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'flatbuffers::Parser().Parse( \"namespace A; union X {} namespace B; table X {}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x362,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  return;
}

Assistant:

void ValidSameNameDifferentNamespaceTest() {
  // Duplicate table names in different namespaces must be parsable
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; table X {} namespace B; table X {}"));
  // Duplicate union names in different namespaces must be parsable
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; union X {} namespace B; union X {}"));
  // Clashing table and union names in different namespaces must be parsable
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; table X {} namespace B; union X {}"));
  TEST_ASSERT(flatbuffers::Parser().Parse(
      "namespace A; union X {} namespace B; table X {}"));
}